

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.hpp
# Opt level: O1

void __thiscall BCL::write<char>(BCL *this,char *src,GlobalPtr<char> dst,size_t size)

{
  int iVar1;
  char *__dest;
  long *plVar2;
  debug_error *pdVar3;
  ulong __n;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  GlobalPtr<char> dst_local;
  MPI_Request request;
  
  __n = dst.ptr;
  dst_local.ptr = dst.rank;
  dst_local.rank = (size_t)src;
  if (my_nprocs < src) {
    pdVar3 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string((string *)&request,dst_local.rank);
    std::operator+(&local_70,"BCL write(): request to write to rank ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&request);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90._M_dataplus._M_p = (pointer)*plVar2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_90._M_dataplus._M_p == psVar4) {
      local_90.field_2._M_allocated_capacity = *psVar4;
      local_90.field_2._8_8_ = plVar2[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar4;
    }
    local_90._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    debug_error::debug_error(pdVar3,&local_90);
    __cxa_throw(pdVar3,&debug_error::typeinfo,debug_error::~debug_error);
  }
  if (my_rank == src) {
    __dest = GlobalPtr<char>::local(&dst_local);
    memcpy(__dest,this,__n);
  }
  else {
    iVar1 = MPI_Rput(this,__n & 0xffffffff,&ompi_mpi_char,src,dst_local.ptr,__n & 0xffffffff,
                     &ompi_mpi_char,win,&request);
    if (iVar1 != 0) {
      pdVar3 = (debug_error *)__cxa_allocate_exception(0x40);
      std::__cxx11::to_string(&local_70,iVar1);
      std::operator+(&local_90,"BCL write(): MPI_Rput return error code.",&local_70);
      debug_error::debug_error(pdVar3,&local_90);
      __cxa_throw(pdVar3,&debug_error::typeinfo,debug_error::~debug_error);
    }
    iVar1 = MPI_Wait(&request,0);
    if (iVar1 != 0) {
      pdVar3 = (debug_error *)__cxa_allocate_exception(0x40);
      std::__cxx11::to_string(&local_70,iVar1);
      std::operator+(&local_90,"BCL write(): MPI_Wait return error code ",&local_70);
      debug_error::debug_error(pdVar3,&local_90);
      __cxa_throw(pdVar3,&debug_error::typeinfo,debug_error::~debug_error);
    }
  }
  return;
}

Assistant:

inline void write(const T *src, GlobalPtr<T> dst, size_t size) {
  BCL_DEBUG(
    if (dst.rank > BCL::backend::nprocs()) {
      throw debug_error("BCL write(): request to write to rank " +
                        std::to_string(dst.rank) + ", which does not exist");
    }
  )
  if (dst.rank == BCL::rank()) {
    std::memcpy(dst.local(), src, size*sizeof(T));
  } else {
    MPI_Request request;

    int error_code = MPI_Rput(src, size*sizeof(T), MPI_CHAR,
                              dst.rank, dst.ptr, size*sizeof(T), MPI_CHAR,
                              BCL::win, &request);
    BCL_DEBUG(
            if (error_code != MPI_SUCCESS) {
              throw debug_error("BCL write(): MPI_Rput return error code." + std::to_string(error_code));
            }
    )

    error_code = MPI_Wait(&request, MPI_STATUS_IGNORE);

    BCL_DEBUG(
            if (error_code != MPI_SUCCESS) {
              throw debug_error("BCL write(): MPI_Wait return error code " + std::to_string(error_code));
            }
    )
  }
}